

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O1

BOOL PALIsShuttingDown(void)

{
  return shutdown_intent.m_val;
}

Assistant:

BOOL PALIsShuttingDown()
{
    /* ROTORTODO: This function may be used to provide a reader/writer-like
       mechanism (or a ref counting one) to prevent PAL APIs that need to access
       PAL runtime data, from working when PAL is shutting down. Each of those API
       should acquire a read access while executing. The shutting down code would
       acquire a write lock, i.e. suspending any new incoming reader, and waiting
       for the current readers to be done. That would allow us to get rid of the
       dangerous suspend-all-other-threads at shutdown time */
    return shutdown_intent;
}